

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::SetBlendFactors(DeviceContextVkImpl *this,float *pBlendFactors)

{
  bool bVar1;
  
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetBlendFactors
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBlendFactors,0);
  if (bVar1) {
    EnsureVkCmdBuffer(this);
    VulkanUtilities::VulkanCommandBuffer::SetBlendConstants
              (&this->m_CommandBuffer,
               (float *)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_BlendFactors);
    return;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetBlendFactors(const float* pBlendFactors)
{
    if (TDeviceContextBase::SetBlendFactors(pBlendFactors, 0))
    {
        EnsureVkCmdBuffer();
        m_CommandBuffer.SetBlendConstants(m_BlendFactors);
    }
}